

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_buffered_stream.h
# Opt level: O3

bool google::protobuf::json_internal::operator==(MaybeOwnedString *lhs,char (*rhs) [10])

{
  bool bVar1;
  int iVar2;
  size_t __n;
  size_t sVar3;
  size_type __rlen;
  string_view sVar4;
  
  sVar4 = MaybeOwnedString::AsView(lhs);
  __n = sVar4._M_len;
  sVar3 = strlen(*rhs);
  if (__n == sVar3) {
    if (__n != 0) {
      iVar2 = bcmp(sVar4._M_str,rhs,__n);
      if (iVar2 != 0) goto LAB_002c816a;
    }
    bVar1 = true;
  }
  else {
LAB_002c816a:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator==(const MaybeOwnedString& lhs, const String& rhs) {
    return lhs.AsView() == rhs;
  }